

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O2

unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
__thiscall duckdb::StreamQueryResult::LockContext(StreamQueryResult *this)

{
  ClientContext *pCVar1;
  InvalidInputException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_RSI;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50 [32];
  string error_str;
  
  if (*(long *)(in_RSI + 0x188) != 0) {
    pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator->
                       ((shared_ptr<duckdb::ClientContext,_true> *)(in_RSI + 0x188));
    make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)this,&pCVar1->context_lock);
    return (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           this;
  }
  ::std::__cxx11::string::string
            ((string *)&error_str,
             "Attempting to execute an unsuccessful or closed pending query result",
             (allocator *)&local_90);
  if (*(char *)(in_RSI + 200) == '\0') {
    ::std::__cxx11::string::string(local_50,"\nError: %s",&local_91);
    ::std::__cxx11::string::string((string *)&local_70,(string *)(in_RSI + 0xf8));
    StringUtil::Format<std::__cxx11::string>(&local_90,(StringUtil *)local_50,&local_70,in_RCX);
    ::std::__cxx11::string::append((string *)&error_str);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string(local_50);
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_00,&error_str);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ClientContextLock> StreamQueryResult::LockContext() {
	if (!context) {
		string error_str = "Attempting to execute an unsuccessful or closed pending query result";
		if (HasError()) {
			error_str += StringUtil::Format("\nError: %s", GetError());
		}
		throw InvalidInputException(error_str);
	}
	return context->LockContext();
}